

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcher.cpp
# Opt level: O0

void __thiscall efsw::FileWatcher::FileWatcher(FileWatcher *this,bool useGenericFileWatcher)

{
  uint uVar1;
  FileWatcherGeneric *pFVar2;
  FileWatcherInotify *this_00;
  bool useGenericFileWatcher_local;
  FileWatcher *this_local;
  
  this->_vptr_FileWatcher = (_func_int **)&PTR__FileWatcher_0013fa58;
  this->mFollowSymlinks = false;
  this->mOutOfScopeLinks = false;
  if (useGenericFileWatcher) {
    pFVar2 = (FileWatcherGeneric *)operator_new(0x48);
    FileWatcherGeneric::FileWatcherGeneric(pFVar2,this);
    this->mImpl = (FileWatcherImpl *)pFVar2;
  }
  else {
    this_00 = (FileWatcherInotify *)operator_new(0xf8);
    FileWatcherInotify::FileWatcherInotify(this_00,this);
    this->mImpl = (FileWatcherImpl *)this_00;
    uVar1 = (*this->mImpl->_vptr_FileWatcherImpl[8])();
    if ((uVar1 & 1) == 0) {
      if (this->mImpl != (FileWatcherImpl *)0x0) {
        if (this->mImpl != (FileWatcherImpl *)0x0) {
          (*this->mImpl->_vptr_FileWatcherImpl[1])();
        }
        this->mImpl = (FileWatcherImpl *)0x0;
      }
      pFVar2 = (FileWatcherGeneric *)operator_new(0x48);
      FileWatcherGeneric::FileWatcherGeneric(pFVar2,this);
      this->mImpl = (FileWatcherImpl *)pFVar2;
    }
  }
  return;
}

Assistant:

FileWatcher::FileWatcher( bool useGenericFileWatcher ) :
	mFollowSymlinks( false ), mOutOfScopeLinks( false ) {
	if ( useGenericFileWatcher ) {
		efDEBUG( "Using backend: Generic\n" );

		mImpl = new FileWatcherGeneric( this );
	} else {
		efDEBUG( "Using backend: %s\n", BACKEND_NAME );

		mImpl = new FILEWATCHER_IMPL( this );

		if ( !mImpl->initOK() ) {
			efSAFE_DELETE( mImpl );

			efDEBUG( "Falled back to backend: %s\n", BACKEND_NAME );

			mImpl = new FileWatcherGeneric( this );
		}
	}
}